

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O0

int AnalyzeHokuyoMessage(char *buf,int buflen)

{
  int iVar1;
  undefined1 local_21;
  int local_20;
  int iStack_1c;
  char Sum;
  int i;
  int buflen_local;
  char *buf_local;
  
  local_20 = 0;
  local_21 = 0;
  if (((0x1c < buflen) && (*buf == 'M')) && (buf[1] == 'D')) {
    iStack_1c = buflen;
    _i = buf;
    iVar1 = __isoc99_sscanf(buf,"MD%04d%04d%02d%01d%02d\n99b\n%04d%c\n",&local_20,&local_20,
                            &local_20,&local_20,&local_20,&local_20,&local_21);
    if (iVar1 == 7) {
      local_20 = 0x19;
      do {
        if ((_i[local_20] == '\n') && (_i[local_20 + 1] == '\n')) {
          return 0;
        }
        local_20 = local_20 + 1;
      } while (local_20 < iStack_1c + -1);
    }
  }
  return 1;
}

Assistant:

inline int AnalyzeHokuyoMessage(char* buf, int buflen)
{
	int i = 0;
	char Sum = 0;

	// Check number of bytes.
	if (buflen < MIN_STANDARD_BUF_LEN_HOKUYO)
	{
		//printf("Invalid number of bytes.\n");
		return EXIT_FAILURE;
	}
	// Check first command character.
	if (buf[0] != 'M')
	{
		return EXIT_FAILURE;
	}
	// Check second command character.
	if (buf[1] != 'D')
	{
		return EXIT_FAILURE;
	}
	// Check the 26 first bytes.
	if (sscanf(buf, "MD%04d%04d%02d%01d%02d\n99b\n%04d%c\n", &i, &i, &i, &i, &i, &i, &Sum) != 7)
	{
		return EXIT_FAILURE;
	}
	// Find the termination code ("\n\n").
	i = 25;
	for (;;)
	{
		if ((buf[i] == '\n')&&(buf[i+1] == '\n')) break;
		i++;
		if (i >= buflen-1) return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}